

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_SequenceComplete
                 (TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT sequenceHandle,BYTE *data,
                 UINT32 dataSize,TPM2B_DIGEST *result)

{
  undefined1 local_442 [8];
  TPM2B_MAX_BUFFER dataBuf;
  TPM2B_DIGEST *result_local;
  BYTE *pBStack_30;
  UINT32 dataSize_local;
  BYTE *data_local;
  TSS_SESSION *pTStack_20;
  TPMI_DH_OBJECT sequenceHandle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  local_442._0_2_ = (undefined2)dataSize;
  if (dataSize < 0x401) {
    dataBuf._1018_8_ = result;
    result_local._4_4_ = dataSize;
    pBStack_30 = data;
    data_local._4_4_ = sequenceHandle;
    pTStack_20 = session;
    session_local = (TSS_SESSION *)tpm;
    MemoryCopy(local_442 + 2,data,dataSize);
    tpm_local._4_4_ =
         TPM2_SequenceComplete
                   ((TSS_DEVICE *)session_local,pTStack_20,data_local._4_4_,
                    (TPM2B_MAX_BUFFER *)local_442,0x40000007,(TPM2B_DIGEST *)dataBuf._1018_8_,
                    (TPMT_TK_HASHCHECK *)0x0);
  }
  else {
    tpm_local._4_4_ = 0x95;
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TSS_SequenceComplete(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          sequenceHandle,     // IN
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPM2B_DIGEST           *result              // OUT
)
{
    TPM2B_MAX_BUFFER    dataBuf;// = { (UINT16)dataSize };
    dataBuf.t.size = (UINT16)dataSize;

    if (dataSize > MAX_DIGEST_BUFFER)
        return TPM_RC_SIZE;
    MemoryCopy(dataBuf.t.buffer, data, dataSize);

    return TPM2_SequenceComplete(tpm, session, sequenceHandle, &dataBuf, TPM_RH_NULL,
        result, NULL);
}